

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int streamMemParseTest(char *filename,char *result,char *err,int options)

{
  int iVar1;
  int local_4c;
  char *pcStack_48;
  int size;
  char *base;
  xmlTextReaderPtr pxStack_38;
  int ret;
  xmlTextReaderPtr reader;
  char *pcStack_28;
  int options_local;
  char *err_local;
  char *result_local;
  char *filename_local;
  
  reader._4_4_ = options;
  pcStack_28 = err;
  err_local = result;
  result_local = filename;
  iVar1 = loadMem(filename,&stack0xffffffffffffffb8,&local_4c);
  if (iVar1 == 0) {
    pxStack_38 = (xmlTextReaderPtr)
                 xmlReaderForMemory(pcStack_48,local_4c,result_local,0,reader._4_4_);
    xmlTextReaderSetStructuredErrorHandler(pxStack_38,testStructuredErrorHandler,0);
    base._4_4_ = streamProcessTest(result_local,err_local,pcStack_28,pxStack_38,(char *)0x0,
                                   reader._4_4_);
    free(pcStack_48);
    xmlFreeTextReader(pxStack_38);
    filename_local._4_4_ = base._4_4_;
  }
  else {
    fprintf(_stderr,"Failed to load %s\n",result_local);
    filename_local._4_4_ = -1;
  }
  return filename_local._4_4_;
}

Assistant:

static int
streamMemParseTest(const char *filename, const char *result, const char *err,
                   int options) {
    xmlTextReaderPtr reader;
    int ret;
    const char *base;
    int size;

    /*
     * load and parse the memory
     */
    if (loadMem(filename, &base, &size) != 0) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }
    reader = xmlReaderForMemory(base, size, filename, NULL, options);
    xmlTextReaderSetStructuredErrorHandler(reader, testStructuredErrorHandler,
                                           NULL);
    ret = streamProcessTest(filename, result, err, reader, NULL, options);
    free((char *)base);
    xmlFreeTextReader(reader);
    return(ret);
}